

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O0

void __thiscall FTGATexture::MakeTexture(FTGATexture *this)

{
  BYTE BVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  BYTE *pBVar5;
  FileReader *pFVar6;
  int local_214;
  BYTE *pBStack_210;
  int x_6;
  BYTE *p_6;
  int y_6;
  int x_5;
  BYTE *p_5;
  int y_5;
  int x_4;
  BYTE *p_4;
  int y_4;
  int x_3;
  BYTE *p_3;
  int y_3;
  int x_2;
  BYTE *p_2;
  int y_2;
  int v;
  int x_1;
  WORD *p_1;
  int y_1;
  int x;
  BYTE *p;
  int local_198;
  int y;
  int Pitch;
  int step_x;
  BYTE *ptr;
  int local_180;
  int Size;
  int i;
  BYTE *buffer;
  BYTE a;
  BYTE b;
  BYTE g;
  BYTE r;
  WORD w;
  TGAHeader hdr;
  FWadLump lump;
  BYTE PaletteMap [256];
  FTGATexture *this_local;
  
  FWadCollection::OpenLumpNum((FWadLump *)&hdr.y_origin,&Wads,(this->super_FTexture).SourceLump);
  pBVar5 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                             (uint)(this->super_FTexture).Height));
  this->Pixels = pBVar5;
  FWadLump::Read((FWadLump *)&hdr.y_origin,(void *)((long)&buffer + 6),0x12);
  FWadLump::Seek((FWadLump *)&hdr.y_origin,(ulong)buffer._6_1_,1);
  if (buffer._7_1_ != '\0') {
    memset(&lump.Lump,0,0x100);
    for (local_180 = (int)_b; local_180 < (int)_b + (int)_r && local_180 < 0x100;
        local_180 = local_180 + 1) {
      uVar4 = (uint)w._1_1_;
      if (uVar4 - 0xf < 2) {
        FileReader::operator>>((FileReader *)&hdr.y_origin,(WORD *)((long)&buffer + 4));
        buffer._3_1_ = (byte)((buffer._4_2_ & 0x1f) << 3);
        buffer._2_1_ = (byte)((int)(buffer._4_2_ & 0x3e0) >> 2);
        buffer._1_1_ = (byte)((int)(buffer._4_2_ & 0x7c00) >> 7);
        buffer._0_1_ = 0xff;
      }
      else if (uVar4 == 0x18) {
        pFVar6 = FileReader::operator>>((FileReader *)&hdr.y_origin,(BYTE *)((long)&buffer + 1));
        pFVar6 = FileReader::operator>>(pFVar6,(BYTE *)((long)&buffer + 2));
        FileReader::operator>>(pFVar6,(BYTE *)((long)&buffer + 3));
        buffer._0_1_ = 0xff;
      }
      else if (uVar4 == 0x20) {
        pFVar6 = FileReader::operator>>((FileReader *)&hdr.y_origin,(BYTE *)((long)&buffer + 1));
        pFVar6 = FileReader::operator>>(pFVar6,(BYTE *)((long)&buffer + 2));
        pFVar6 = FileReader::operator>>(pFVar6,(BYTE *)((long)&buffer + 3));
        FileReader::operator>>(pFVar6,(BYTE *)&buffer);
        if ((hdr.x_origin._1_1_ & 0xf) != 8) {
          buffer._0_1_ = 0xff;
        }
      }
      else {
        buffer._0_1_ = 0;
        buffer._1_1_ = 0;
        buffer._2_1_ = 0;
        buffer._3_1_ = 0;
      }
      if ((byte)buffer < 0x80) {
        BVar1 = '\0';
      }
      else {
        BVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)buffer._3_1_,(uint)buffer._2_1_,
                                    (uint)buffer._1_1_);
      }
      PaletteMap[(long)local_180 + -8] = BVar1;
    }
  }
  iVar3 = (uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height *
          (uint)((byte)hdr.x_origin >> 3);
  pBVar5 = (BYTE *)operator_new__((long)iVar3);
  if (a < 4) {
    FWadLump::Read((FWadLump *)&hdr.y_origin,pBVar5,(long)iVar3);
  }
  else {
    ReadCompressed(this,(FileReader *)&hdr.y_origin,pBVar5,(uint)((byte)hdr.x_origin >> 3));
  }
  iVar3 = (int)(uint)(byte)hdr.x_origin >> 3;
  local_198 = (uint)(this->super_FTexture).Width * iVar3;
  _Pitch = pBVar5;
  if ((hdr.x_origin._1_1_ & 0x20) == 0) {
    _Pitch = pBVar5 + (int)(((this->super_FTexture).Height - 1) * local_198);
    local_198 = -local_198;
  }
  bVar2 = a & 7;
  if (bVar2 == 1) {
    for (p._4_4_ = 0; p._4_4_ < (int)(uint)(this->super_FTexture).Height; p._4_4_ = p._4_4_ + 1) {
      _y_1 = _Pitch + p._4_4_ * local_198;
      for (p_1._4_4_ = 0; p_1._4_4_ < (int)(uint)(this->super_FTexture).Width;
          p_1._4_4_ = p_1._4_4_ + 1) {
        this->Pixels[(int)(p_1._4_4_ * (uint)(this->super_FTexture).Height + p._4_4_)] =
             PaletteMap[(ulong)*_y_1 - 8];
        _y_1 = _y_1 + iVar3;
      }
    }
  }
  else if (bVar2 == 2) {
    uVar4 = (uint)(byte)hdr.x_origin;
    if (uVar4 - 0xf < 2) {
      for (p_1._0_4_ = 0; (int)p_1 < (int)(uint)(this->super_FTexture).Height;
          p_1._0_4_ = (int)p_1 + 1) {
        _v = (ushort *)(_Pitch + (int)p_1 * local_198);
        for (y_2 = 0; y_2 < (int)(uint)(this->super_FTexture).Width; y_2 = y_2 + 1) {
          uVar4 = (uint)*_v;
          this->Pixels[(int)(y_2 * (uint)(this->super_FTexture).Height + (int)p_1)] =
               RGB32k.All
               [(long)(int)(uVar4 & 0x1f) +
                (long)(int)((int)uVar4 >> 5 & 0x1f) * 0x20 +
                (long)(int)((int)uVar4 >> 10 & 0x1f) * 0x400];
          _v = _v + ((int)(uint)(byte)hdr.x_origin >> 4);
        }
      }
    }
    else if (uVar4 == 0x18) {
      for (p_2._4_4_ = 0; p_2._4_4_ < (int)(uint)(this->super_FTexture).Height;
          p_2._4_4_ = p_2._4_4_ + 1) {
        _y_3 = _Pitch + p_2._4_4_ * local_198;
        for (p_3._4_4_ = 0; p_3._4_4_ < (int)(uint)(this->super_FTexture).Width;
            p_3._4_4_ = p_3._4_4_ + 1) {
          this->Pixels[(int)(p_3._4_4_ * (uint)(this->super_FTexture).Height + p_2._4_4_)] =
               RGB32k.All
               [(long)((int)(uint)*_y_3 >> 3) +
                (long)((int)(uint)_y_3[1] >> 3) * 0x20 + (long)((int)(uint)_y_3[2] >> 3) * 0x400];
          _y_3 = _y_3 + iVar3;
        }
      }
    }
    else if (uVar4 == 0x20) {
      if ((hdr.x_origin._1_1_ & 0xf) == 8) {
        for (p_4._0_4_ = 0; (int)p_4 < (int)(uint)(this->super_FTexture).Height;
            p_4._0_4_ = (int)p_4 + 1) {
          _y_5 = _Pitch + (int)p_4 * local_198;
          for (p_5._4_4_ = 0; p_5._4_4_ < (int)(uint)(this->super_FTexture).Width;
              p_5._4_4_ = p_5._4_4_ + 1) {
            if (_y_5[3] < 0x80) {
              BVar1 = '\0';
            }
            else {
              BVar1 = RGB32k.All
                      [(long)((int)(uint)*_y_5 >> 3) +
                       (long)((int)(uint)_y_5[1] >> 3) * 0x20 +
                       (long)((int)(uint)_y_5[2] >> 3) * 0x400];
            }
            this->Pixels[(int)(p_5._4_4_ * (uint)(this->super_FTexture).Height + (int)p_4)] = BVar1;
            _y_5 = _y_5 + iVar3;
          }
        }
      }
      else {
        for (p_3._0_4_ = 0; (int)p_3 < (int)(uint)(this->super_FTexture).Height;
            p_3._0_4_ = (int)p_3 + 1) {
          _y_4 = _Pitch + (int)p_3 * local_198;
          for (p_4._4_4_ = 0; p_4._4_4_ < (int)(uint)(this->super_FTexture).Width;
              p_4._4_4_ = p_4._4_4_ + 1) {
            this->Pixels[(int)(p_4._4_4_ * (uint)(this->super_FTexture).Height + (int)p_3)] =
                 RGB32k.All
                 [(long)((int)(uint)*_y_4 >> 3) +
                  (long)((int)(uint)_y_4[1] >> 3) * 0x20 + (long)((int)(uint)_y_4[2] >> 3) * 0x400];
            _y_4 = _y_4 + iVar3;
          }
        }
      }
    }
  }
  else if (bVar2 == 3) {
    if ((byte)hdr.x_origin == 8) {
      for (p_5._0_4_ = 0; (int)p_5 < (int)(uint)(this->super_FTexture).Height;
          p_5._0_4_ = (int)p_5 + 1) {
        _y_6 = _Pitch + (int)p_5 * local_198;
        for (p_6._4_4_ = 0; p_6._4_4_ < (int)(uint)(this->super_FTexture).Width;
            p_6._4_4_ = p_6._4_4_ + 1) {
          this->Pixels[(int)(p_6._4_4_ * (uint)(this->super_FTexture).Height + (int)p_5)] =
               FTexture::GrayMap[*_y_6];
          _y_6 = _y_6 + iVar3;
        }
      }
    }
    else if ((byte)hdr.x_origin == 0x10) {
      for (p_6._0_4_ = 0; (int)p_6 < (int)(uint)(this->super_FTexture).Height;
          p_6._0_4_ = (int)p_6 + 1) {
        pBStack_210 = _Pitch + (int)p_6 * local_198;
        for (local_214 = 0; local_214 < (int)(uint)(this->super_FTexture).Width;
            local_214 = local_214 + 1) {
          this->Pixels[(int)(local_214 * (uint)(this->super_FTexture).Height + (int)p_6)] =
               FTexture::GrayMap[pBStack_210[1]];
          pBStack_210 = pBStack_210 + iVar3;
        }
      }
    }
  }
  if (pBVar5 != (BYTE *)0x0) {
    operator_delete__(pBVar5);
  }
  FWadLump::~FWadLump((FWadLump *)&hdr.y_origin);
  return;
}

Assistant:

void FTGATexture::MakeTexture ()
{
	BYTE PaletteMap[256];
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	TGAHeader hdr;
	WORD w;
	BYTE r,g,b,a;
	BYTE * buffer;

	Pixels = new BYTE[Width*Height];
	lump.Read(&hdr, sizeof(hdr));
	lump.Seek(hdr.id_len, SEEK_CUR);
	
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	hdr.cm_first = LittleShort(hdr.cm_first);
	hdr.cm_length = LittleShort(hdr.cm_length);

	if (hdr.has_cm)
	{
		memset(PaletteMap, 0, 256);
		for (int i = hdr.cm_first; i < hdr.cm_first + hdr.cm_length && i < 256; i++)
		{
			switch (hdr.cm_size)
			{
			case 15:
			case 16:
				lump >> w;
				r = (w & 0x001F) << 3;
				g = (w & 0x03E0) >> 2;
				b = (w & 0x7C00) >> 7;
				a = 255;
				break;
				
			case 24:
				lump >> b >> g >> r;
				a=255;
				break;
				
			case 32:
				lump >> b >> g >> r >> a;
				if ((hdr.img_desc&15)!=8) a=255;
				break;
				
			default:	// should never happen
				r=g=b=a=0;
				break;
			}
			PaletteMap[i] = a>=128? ColorMatcher.Pick(r, g, b) : 0;
		}
    }
    
    int Size = Width * Height * (hdr.bpp>>3);
   	buffer = new BYTE[Size];
   	
    if (hdr.img_type < 4)	// uncompressed
    {
    	lump.Read(buffer, Size);
    }
    else				// compressed
    {
    	ReadCompressed(lump, buffer, hdr.bpp>>3);
    }
    
	BYTE * ptr = buffer;
	int step_x = (hdr.bpp>>3);
	int Pitch = Width * step_x;

	/*
	if (hdr.img_desc&32)
	{
		ptr += (Width-1) * step_x;
		step_x =- step_x;
	}
	*/
	if (!(hdr.img_desc&32))
	{
		ptr += (Height-1) * Pitch;
		Pitch = -Pitch;
	}

    switch (hdr.img_type & 7)
    {
	case 1:	// paletted
		for(int y=0;y<Height;y++)
		{
			BYTE * p = ptr + y * Pitch;
			for(int x=0;x<Width;x++)
			{
				Pixels[x*Height+y] = PaletteMap[*p];
				p+=step_x;
			}
		}
		break;

	case 2:	// RGB
		switch (hdr.bpp)
		{
		case 15:
		case 16:
			step_x>>=1;
			for(int y=0;y<Height;y++)
			{
				WORD * p = (WORD*)(ptr + y * Pitch);
				for(int x=0;x<Width;x++)
				{
					int v = LittleLong(*p);
					Pixels[x*Height+y] = RGB32k.RGB[(v>>10) & 0x1f][(v>>5) & 0x1f][v & 0x1f];
					p+=step_x;
				}
			}
			break;
		
		case 24:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
					p+=step_x;
				}
			}
			break;
		
		case 32:
			if ((hdr.img_desc&15)!=8)	// 32 bits without a valid alpha channel
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
						p+=step_x;
					}
				}
			}
			else
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = p[3] >= 128? RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3] : 0;
						p+=step_x;
					}
				}
			}
			break;
		
		default:
			break;
		}
		break;
	
	case 3:	// Grayscale
		switch (hdr.bpp)
		{
		case 8:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[*p];
					p+=step_x;
				}
			}
			break;
		
		case 16:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[p[1]];	// only use the high byte
					p+=step_x;
				}
			}
			break;
		
		default:
			break;
		}
		break;

	default:
		break;
    }
	delete [] buffer;
}